

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void progressStart(void)

{
  ostream *this;
  __atomic_base<unsigned_long> *unaff_retaddr;
  int local_c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  std::__atomic_base<unsigned_long>::operator=
            (unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  local_c = embree::getTerminalWidth();
  if (local_c < 4) {
    local_c = 3;
  }
  embree::progressWidth = local_c;
  this = std::operator<<((ostream *)&std::cout,"[");
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void progressStart()
  {
    progressDots = 0;
    progressWidth = max(3,getTerminalWidth());
    std::cout << "[" << std::flush;
  }